

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O3

void __thiscall
APowerDamage::ModifyDamage
          (APowerDamage *this,int damage,FName *damageType,int *newdamage,bool passive)

{
  PType *this_00;
  AActor *ent;
  AInventory *pAVar1;
  int iVar2;
  hash_t hVar3;
  int iVar4;
  undefined4 extraout_var;
  int local_3c;
  FSoundID local_38;
  FName local_34;
  PClass *pPVar5;
  
  if (0 < damage && !passive) {
    pPVar5 = (this->super_APowerup).super_AInventory.super_AActor.super_DThinker.super_DObject.Class
    ;
    if (pPVar5 == (PClass *)0x0) {
      iVar2 = (**(this->super_APowerup).super_AInventory.super_AActor.super_DThinker.super_DObject.
                 _vptr_DObject)(this);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar2);
      (this->super_APowerup).super_AInventory.super_AActor.super_DThinker.super_DObject.Class =
           pPVar5;
    }
    this_00 = pPVar5[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.HashNext;
    if ((this_00 == (PType *)0x0) ||
       (hVar3 = TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::CountUsed
                          ((TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *)this_00
                          ), hVar3 == 0)) {
      iVar2 = damage * 4;
    }
    else {
      local_34 = (FName)damageType->Index;
      iVar4 = DmgFactors::Apply((DmgFactors *)this_00,&local_34,damage);
      iVar2 = 1;
      if (1 < iVar4) {
        iVar2 = iVar4;
      }
    }
    ent = (this->super_APowerup).super_AInventory.Owner.field_0.p;
    if (ent != (AActor *)0x0) {
      if (((ent->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        if (damage < iVar2) {
          local_38.ID = (this->super_APowerup).super_AInventory.super_AActor.ActiveSound.
                        super_FSoundID.ID;
          S_Sound(ent,5,&local_38,1.0,0.0);
        }
      }
      else {
        (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
      }
    }
    *newdamage = iVar2;
  }
  pAVar1 = (this->super_APowerup).super_AInventory.super_AActor.Inventory.field_0.p;
  if (pAVar1 != (AInventory *)0x0) {
    if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      local_3c = damageType->Index;
      (*(pAVar1->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x3c])
                (pAVar1,damage,&local_3c,newdamage,passive);
    }
    else {
      (this->super_APowerup).super_AInventory.super_AActor.Inventory.field_0.p = (AInventory *)0x0;
    }
  }
  return;
}

Assistant:

void APowerDamage::ModifyDamage(int damage, FName damageType, int &newdamage, bool passive)
{
	if (!passive && damage > 0)
	{
		int newdam;
		DmgFactors *df = GetClass()->DamageFactors;
		if (df != NULL && df->CountUsed() != 0)
		{
			newdam = MAX(1, df->Apply(damageType, damage));// don't allow zero damage as result of an underflow
		}
		else
		{
			newdam = damage * 4;
		}
		if (Owner != NULL && newdam > damage) S_Sound(Owner, 5, ActiveSound, 1.0f, ATTN_NONE);
		newdamage = newdam;
	}
	if (Inventory != NULL) Inventory->ModifyDamage(damage, damageType, newdamage, passive);
}